

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_path_exclusion(archive_match *a,match *m,wchar_t mbs,void *pn)

{
  wchar_t wVar1;
  int *piVar2;
  wchar_t *local_48;
  wchar_t *p_1;
  char *p;
  wchar_t r;
  wchar_t flag;
  void *pn_local;
  match *pmStack_20;
  wchar_t mbs_local;
  match *m_local;
  archive_match *a_local;
  
  p._4_4_ = L'\x03';
  _r = (wchar_t *)pn;
  pn_local._4_4_ = mbs;
  pmStack_20 = m;
  m_local = (match *)a;
  if (mbs == L'\0') {
    p._0_4_ = archive_mstring_get_wcs(&a->archive,&m->pattern,&local_48);
    if ((wchar_t)p == L'\0') {
      wVar1 = __archive_pathmatch_w(local_48,_r,p._4_4_);
      return wVar1;
    }
  }
  else {
    p._0_4_ = archive_mstring_get_mbs(&a->archive,&m->pattern,(char **)&p_1);
    if ((wchar_t)p == L'\0') {
      wVar1 = __archive_pathmatch((char *)p_1,(char *)_r,p._4_4_);
      return wVar1;
    }
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0xc) {
    a_local._4_4_ = error_nomem((archive_match *)m_local);
  }
  else {
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
match_path_exclusion(struct archive_match *a, struct match *m,
    int mbs, const void *pn)
{
	int flag = PATHMATCH_NO_ANCHOR_START | PATHMATCH_NO_ANCHOR_END;
	int r;

	if (mbs) {
		const char *p;
		r = archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch(p, (const char *)pn, flag));
	} else {
		const wchar_t *p;
		r = archive_mstring_get_wcs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch_w(p, (const wchar_t *)pn,
				flag));
	}
	if (errno == ENOMEM)
		return (error_nomem(a));
	return (0);
}